

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCtxtUseOptionsInternal(xmlParserCtxtPtr ctxt,int options,char *encoding)

{
  xmlChar *pxVar1;
  char *encoding_local;
  int options_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0xffffffff;
  }
  else {
    if (encoding != (char *)0x0) {
      if (ctxt->encoding != (xmlChar *)0x0) {
        (*xmlFree)(ctxt->encoding);
      }
      pxVar1 = xmlStrdup((xmlChar *)encoding);
      ctxt->encoding = pxVar1;
    }
    if ((options & 1U) == 0) {
      ctxt->recovery = 0;
      encoding_local._4_4_ = options;
    }
    else {
      ctxt->recovery = 1;
      encoding_local._4_4_ = options - 1;
      ctxt->options = ctxt->options | 1;
    }
    if ((encoding_local._4_4_ & 4) == 0) {
      ctxt->loadsubset = 0;
    }
    else {
      ctxt->loadsubset = 2;
      encoding_local._4_4_ = encoding_local._4_4_ - 4;
      ctxt->options = ctxt->options | 4;
    }
    if ((encoding_local._4_4_ & 8) != 0) {
      ctxt->loadsubset = ctxt->loadsubset | 4;
      encoding_local._4_4_ = encoding_local._4_4_ - 8;
      ctxt->options = ctxt->options | 8;
    }
    if ((encoding_local._4_4_ & 2) == 0) {
      ctxt->replaceEntities = 0;
    }
    else {
      ctxt->replaceEntities = 1;
      encoding_local._4_4_ = encoding_local._4_4_ - 2;
      ctxt->options = ctxt->options | 2;
    }
    if ((encoding_local._4_4_ & 0x80) == 0) {
      ctxt->pedantic = 0;
    }
    else {
      ctxt->pedantic = 1;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x80;
      ctxt->options = ctxt->options | 0x80;
    }
    if ((encoding_local._4_4_ & 0x100) == 0) {
      ctxt->keepBlanks = 1;
    }
    else {
      ctxt->keepBlanks = 0;
      ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x100;
      ctxt->options = ctxt->options | 0x100;
    }
    if ((encoding_local._4_4_ & 0x10) == 0) {
      ctxt->validate = 0;
    }
    else {
      ctxt->validate = 1;
      if ((encoding_local._4_4_ & 0x40) != 0) {
        (ctxt->vctxt).warning = (xmlValidityWarningFunc)0x0;
      }
      if ((encoding_local._4_4_ & 0x20) != 0) {
        (ctxt->vctxt).error = (xmlValidityErrorFunc)0x0;
      }
      encoding_local._4_4_ = encoding_local._4_4_ - 0x10;
      ctxt->options = ctxt->options | 0x10;
    }
    if ((encoding_local._4_4_ & 0x40) != 0) {
      ctxt->sax->warning = (warningSAXFunc)0x0;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x40;
    }
    if ((encoding_local._4_4_ & 0x20) != 0) {
      ctxt->sax->error = (errorSAXFunc)0x0;
      ctxt->sax->fatalError = (fatalErrorSAXFunc)0x0;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x20;
    }
    if ((encoding_local._4_4_ & 0x200) != 0) {
      ctxt->sax->startElement = xmlSAX2StartElement;
      ctxt->sax->endElement = xmlSAX2EndElement;
      ctxt->sax->startElementNs = (startElementNsSAX2Func)0x0;
      ctxt->sax->endElementNs = (endElementNsSAX2Func)0x0;
      ctxt->sax->initialized = 1;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x200;
      ctxt->options = ctxt->options | 0x200;
    }
    if ((encoding_local._4_4_ & 0x1000) == 0) {
      ctxt->dictNames = 1;
    }
    else {
      ctxt->dictNames = 0;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x1000;
      ctxt->options = ctxt->options | 0x1000;
    }
    if ((encoding_local._4_4_ & 0x4000) != 0) {
      ctxt->sax->cdataBlock = (cdataBlockSAXFunc)0x0;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x4000;
      ctxt->options = ctxt->options | 0x4000;
    }
    if ((encoding_local._4_4_ & 0x2000) != 0) {
      ctxt->options = ctxt->options | 0x2000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x2000;
    }
    if ((encoding_local._4_4_ & 0x800) != 0) {
      ctxt->options = ctxt->options | 0x800;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x800;
    }
    if ((encoding_local._4_4_ & 0x10000) != 0) {
      ctxt->options = ctxt->options | 0x10000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x10000;
    }
    if ((encoding_local._4_4_ & 0x20000) != 0) {
      ctxt->options = ctxt->options | 0x20000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x20000;
    }
    if ((encoding_local._4_4_ & 0x40000) != 0) {
      ctxt->options = ctxt->options | 0x40000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x40000;
    }
    if ((encoding_local._4_4_ & 0x80000) != 0) {
      ctxt->options = ctxt->options | 0x80000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x80000;
      if (ctxt->dict != (xmlDictPtr)0x0) {
        xmlDictSetLimit(ctxt->dict,0);
      }
    }
    if ((encoding_local._4_4_ & 0x100000) != 0) {
      ctxt->options = ctxt->options | 0x100000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x100000;
    }
    if ((encoding_local._4_4_ & 0x200000) != 0) {
      ctxt->options = ctxt->options | 0x200000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x200000;
    }
    if ((encoding_local._4_4_ & 0x400000) != 0) {
      ctxt->options = ctxt->options | 0x400000;
      encoding_local._4_4_ = encoding_local._4_4_ - 0x400000;
    }
    ctxt->linenumbers = 1;
    ctxt_local._4_4_ = encoding_local._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlCtxtUseOptionsInternal(xmlParserCtxtPtr ctxt, int options, const char *encoding)
{
    if (ctxt == NULL)
        return(-1);
    if (encoding != NULL) {
        if (ctxt->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->encoding);
        ctxt->encoding = xmlStrdup((const xmlChar *) encoding);
    }
    if (options & XML_PARSE_RECOVER) {
        ctxt->recovery = 1;
        options -= XML_PARSE_RECOVER;
	ctxt->options |= XML_PARSE_RECOVER;
    } else
        ctxt->recovery = 0;
    if (options & XML_PARSE_DTDLOAD) {
        ctxt->loadsubset = XML_DETECT_IDS;
        options -= XML_PARSE_DTDLOAD;
	ctxt->options |= XML_PARSE_DTDLOAD;
    } else
        ctxt->loadsubset = 0;
    if (options & XML_PARSE_DTDATTR) {
        ctxt->loadsubset |= XML_COMPLETE_ATTRS;
        options -= XML_PARSE_DTDATTR;
	ctxt->options |= XML_PARSE_DTDATTR;
    }
    if (options & XML_PARSE_NOENT) {
        ctxt->replaceEntities = 1;
        /* ctxt->loadsubset |= XML_DETECT_IDS; */
        options -= XML_PARSE_NOENT;
	ctxt->options |= XML_PARSE_NOENT;
    } else
        ctxt->replaceEntities = 0;
    if (options & XML_PARSE_PEDANTIC) {
        ctxt->pedantic = 1;
        options -= XML_PARSE_PEDANTIC;
	ctxt->options |= XML_PARSE_PEDANTIC;
    } else
        ctxt->pedantic = 0;
    if (options & XML_PARSE_NOBLANKS) {
        ctxt->keepBlanks = 0;
        ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
        options -= XML_PARSE_NOBLANKS;
	ctxt->options |= XML_PARSE_NOBLANKS;
    } else
        ctxt->keepBlanks = 1;
    if (options & XML_PARSE_DTDVALID) {
        ctxt->validate = 1;
        if (options & XML_PARSE_NOWARNING)
            ctxt->vctxt.warning = NULL;
        if (options & XML_PARSE_NOERROR)
            ctxt->vctxt.error = NULL;
        options -= XML_PARSE_DTDVALID;
	ctxt->options |= XML_PARSE_DTDVALID;
    } else
        ctxt->validate = 0;
    if (options & XML_PARSE_NOWARNING) {
        ctxt->sax->warning = NULL;
        options -= XML_PARSE_NOWARNING;
    }
    if (options & XML_PARSE_NOERROR) {
        ctxt->sax->error = NULL;
        ctxt->sax->fatalError = NULL;
        options -= XML_PARSE_NOERROR;
    }
#ifdef LIBXML_SAX1_ENABLED
    if (options & XML_PARSE_SAX1) {
        ctxt->sax->startElement = xmlSAX2StartElement;
        ctxt->sax->endElement = xmlSAX2EndElement;
        ctxt->sax->startElementNs = NULL;
        ctxt->sax->endElementNs = NULL;
        ctxt->sax->initialized = 1;
        options -= XML_PARSE_SAX1;
	ctxt->options |= XML_PARSE_SAX1;
    }
#endif /* LIBXML_SAX1_ENABLED */
    if (options & XML_PARSE_NODICT) {
        ctxt->dictNames = 0;
        options -= XML_PARSE_NODICT;
	ctxt->options |= XML_PARSE_NODICT;
    } else {
        ctxt->dictNames = 1;
    }
    if (options & XML_PARSE_NOCDATA) {
        ctxt->sax->cdataBlock = NULL;
        options -= XML_PARSE_NOCDATA;
	ctxt->options |= XML_PARSE_NOCDATA;
    }
    if (options & XML_PARSE_NSCLEAN) {
	ctxt->options |= XML_PARSE_NSCLEAN;
        options -= XML_PARSE_NSCLEAN;
    }
    if (options & XML_PARSE_NONET) {
	ctxt->options |= XML_PARSE_NONET;
        options -= XML_PARSE_NONET;
    }
    if (options & XML_PARSE_COMPACT) {
	ctxt->options |= XML_PARSE_COMPACT;
        options -= XML_PARSE_COMPACT;
    }
    if (options & XML_PARSE_OLD10) {
	ctxt->options |= XML_PARSE_OLD10;
        options -= XML_PARSE_OLD10;
    }
    if (options & XML_PARSE_NOBASEFIX) {
	ctxt->options |= XML_PARSE_NOBASEFIX;
        options -= XML_PARSE_NOBASEFIX;
    }
    if (options & XML_PARSE_HUGE) {
	ctxt->options |= XML_PARSE_HUGE;
        options -= XML_PARSE_HUGE;
        if (ctxt->dict != NULL)
            xmlDictSetLimit(ctxt->dict, 0);
    }
    if (options & XML_PARSE_OLDSAX) {
	ctxt->options |= XML_PARSE_OLDSAX;
        options -= XML_PARSE_OLDSAX;
    }
    if (options & XML_PARSE_IGNORE_ENC) {
	ctxt->options |= XML_PARSE_IGNORE_ENC;
        options -= XML_PARSE_IGNORE_ENC;
    }
    if (options & XML_PARSE_BIG_LINES) {
	ctxt->options |= XML_PARSE_BIG_LINES;
        options -= XML_PARSE_BIG_LINES;
    }
    ctxt->linenumbers = 1;
    return (options);
}